

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetActiveID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiInputSource IVar2;
  bool bVar3;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  GImGui->ActiveIdIsJustActivated = GImGui->ActiveId != id;
  if ((pIVar1->ActiveIdIsJustActivated & 1U) != 0) {
    pIVar1->ActiveIdTimer = 0.0;
    pIVar1->ActiveIdHasBeenPressedBefore = false;
    pIVar1->ActiveIdHasBeenEditedBefore = false;
    if (id != 0) {
      pIVar1->LastActiveId = id;
      pIVar1->LastActiveIdTimer = 0.0;
    }
  }
  pIVar1->ActiveId = id;
  pIVar1->ActiveIdAllowNavDirFlags = 0;
  pIVar1->ActiveIdBlockNavInputFlags = 0;
  pIVar1->ActiveIdAllowOverlap = false;
  pIVar1->ActiveIdWindow = window;
  pIVar1->ActiveIdHasBeenEditedThisFrame = false;
  if (id != 0) {
    pIVar1->ActiveIdIsAlive = id;
    bVar3 = true;
    if (((pIVar1->NavActivateId != id) && (bVar3 = true, pIVar1->NavInputId != id)) &&
       (bVar3 = true, pIVar1->NavJustTabbedId != id)) {
      bVar3 = pIVar1->NavJustMovedToId == id;
    }
    IVar2 = ImGuiInputSource_Mouse;
    if (bVar3) {
      IVar2 = ImGuiInputSource_Nav;
    }
    pIVar1->ActiveIdSource = IVar2;
  }
  return;
}

Assistant:

void ImGui::SetActiveID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.ActiveIdIsJustActivated = (g.ActiveId != id);
    if (g.ActiveIdIsJustActivated)
    {
        g.ActiveIdTimer = 0.0f;
        g.ActiveIdHasBeenPressedBefore = false;
        g.ActiveIdHasBeenEditedBefore = false;
        if (id != 0)
        {
            g.LastActiveId = id;
            g.LastActiveIdTimer = 0.0f;
        }
    }
    g.ActiveId = id;
    g.ActiveIdAllowNavDirFlags = 0;
    g.ActiveIdBlockNavInputFlags = 0;
    g.ActiveIdAllowOverlap = false;
    g.ActiveIdWindow = window;
    g.ActiveIdHasBeenEditedThisFrame = false;
    if (id)
    {
        g.ActiveIdIsAlive = id;
        g.ActiveIdSource = (g.NavActivateId == id || g.NavInputId == id || g.NavJustTabbedId == id || g.NavJustMovedToId == id) ? ImGuiInputSource_Nav : ImGuiInputSource_Mouse;
    }
}